

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

void __thiscall
QGraphicsScene::mouseReleaseEvent(QGraphicsScene *this,QGraphicsSceneMouseEvent *mouseEvent)

{
  bool bVar1;
  QGraphicsScenePrivate *this_00;
  QGraphicsItem **ppQVar2;
  socklen_t *in_RCX;
  sockaddr *__addr;
  int __fd;
  QEvent *in_RSI;
  QGraphicsSceneHoverEvent *in_RDI;
  long in_FS_OFFSET;
  QGraphicsSceneMouseEvent *unaff_retaddr;
  QGraphicsScenePrivate *d;
  QGraphicsSceneHoverEvent hoverEvent;
  QGraphicsSceneHoverEvent *in_stack_00000040;
  QGraphicsScenePrivate *in_stack_00000048;
  QGraphicsItem *in_stack_ffffffffffffffb8;
  Type type;
  QFlagsStorageHelper<Qt::MouseButton,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QGraphicsScene *)0x9d2fba);
  bVar1 = QList<QGraphicsItem_*>::isEmpty((QList<QGraphicsItem_*> *)0x9d2fd0);
  if (bVar1) {
    QEvent::ignore(in_RSI);
  }
  else {
    __fd = (int)in_RSI;
    QGraphicsScenePrivate::sendMouseEvent
              ((QGraphicsScenePrivate *)hoverEvent.super_QGraphicsSceneEvent._8_8_,
               (QGraphicsSceneMouseEvent *)hoverEvent.super_QGraphicsSceneEvent._0_8_);
    QEvent::accept(in_RSI,__fd,__addr,in_RCX);
    type = (Type)((ulong)in_RSI >> 0x20);
    local_c.super_QFlagsStorage<Qt::MouseButton>.i =
         (QFlagsStorage<Qt::MouseButton>)
         QGraphicsSceneMouseEvent::buttons((QGraphicsSceneMouseEvent *)this_00);
    bVar1 = QFlags<Qt::MouseButton>::operator!((QFlags<Qt::MouseButton> *)&local_c);
    if (bVar1) {
      bVar1 = QList<QGraphicsItem_*>::isEmpty((QList<QGraphicsItem_*> *)0x9d3030);
      if (bVar1) {
        this_00->lastMouseGrabberItem = (QGraphicsItem *)0x0;
      }
      else {
        ppQVar2 = QList<QGraphicsItem_*>::constLast
                            ((QList<QGraphicsItem_*> *)in_stack_ffffffffffffffb8);
        this_00->lastMouseGrabberItem = *ppQVar2;
        if ((*(uint *)&this_00->field_0xb8 >> 0xb & 1) != 0) {
          QList<QGraphicsItem_*>::constLast((QList<QGraphicsItem_*> *)in_stack_ffffffffffffffb8);
          QGraphicsItem::ungrabMouse(in_stack_ffffffffffffffb8);
        }
      }
      QGraphicsSceneHoverEvent::QGraphicsSceneHoverEvent(in_RDI,type);
      _q_hoverFromMouseEvent((QGraphicsSceneHoverEvent *)d,unaff_retaddr);
      QGraphicsScenePrivate::dispatchHoverEvent(in_stack_00000048,in_stack_00000040);
      QGraphicsSceneHoverEvent::~QGraphicsSceneHoverEvent((QGraphicsSceneHoverEvent *)0x9d30ed);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsScene::mouseReleaseEvent(QGraphicsSceneMouseEvent *mouseEvent)
{
    Q_D(QGraphicsScene);
    if (d->mouseGrabberItems.isEmpty()) {
        mouseEvent->ignore();
        return;
    }

    // Forward the event to the mouse grabber
    d->sendMouseEvent(mouseEvent);
    mouseEvent->accept();

    // Reset the mouse grabber when the last mouse button has been released.
    if (!mouseEvent->buttons()) {
        if (!d->mouseGrabberItems.isEmpty()) {
            d->lastMouseGrabberItem = d->mouseGrabberItems.constLast();
            if (d->lastMouseGrabberItemHasImplicitMouseGrab)
                d->mouseGrabberItems.constLast()->ungrabMouse();
        } else {
            d->lastMouseGrabberItem = nullptr;
        }

        // Generate a hoverevent
        QGraphicsSceneHoverEvent hoverEvent;
        _q_hoverFromMouseEvent(&hoverEvent, mouseEvent);
        d->dispatchHoverEvent(&hoverEvent);
    }
}